

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O3

void cpu_set_cwp_sparc64(CPUSPARCState_conflict1 *env,int new_cwp)

{
  uint32_t uVar1;
  target_ulong tVar2;
  ulong uVar3;
  
  uVar1 = env->nwindows;
  if (env->cwp == uVar1 - 1) {
    uVar3 = (ulong)(uVar1 << 4);
    tVar2 = (env->regbase + uVar3)[1];
    env->regbase[0] = env->regbase[uVar3];
    env->regbase[1] = tVar2;
    tVar2 = (env->regbase + uVar3 + 2)[1];
    env->regbase[2] = env->regbase[uVar3 + 2];
    env->regbase[3] = tVar2;
    tVar2 = (env->regbase + uVar3 + 4)[1];
    env->regbase[4] = env->regbase[uVar3 + 4];
    env->regbase[5] = tVar2;
    tVar2 = (env->regbase + uVar3 + 6)[1];
    env->regbase[6] = env->regbase[uVar3 + 6];
    env->regbase[7] = tVar2;
  }
  env->cwp = new_cwp;
  if (uVar1 - 1 == new_cwp) {
    uVar3 = (ulong)(uVar1 << 4);
    env->regbase[uVar3] = env->regbase[0];
    env->regbase[uVar3 + 1] = env->regbase[1];
    env->regbase[uVar3 + 2] = env->regbase[2];
    env->regbase[uVar3 + 3] = env->regbase[3];
    env->regbase[uVar3 + 4] = env->regbase[4];
    env->regbase[uVar3 + 5] = env->regbase[5];
    env->regbase[uVar3 + 6] = env->regbase[6];
    env->regbase[uVar3 + 7] = env->regbase[7];
  }
  env->regwptr = env->regbase + (new_cwp << 4);
  return;
}

Assistant:

void cpu_set_cwp(CPUSPARCState *env, int new_cwp)
{
    /* put the modified wrap registers at their proper location */
    if (env->cwp == env->nwindows - 1) {
        memcpy32(env->regbase, env->regbase + env->nwindows * 16);
    }
    env->cwp = new_cwp;

    /* put the wrap registers at their temporary location */
    if (new_cwp == env->nwindows - 1) {
        memcpy32(env->regbase + env->nwindows * 16, env->regbase);
    }
    env->regwptr = env->regbase + (new_cwp * 16);
}